

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

void deqp::ub::anon_unknown_1::computeStd140Layout
               (UniformLayout *layout,int *curOffset,int curBlockNdx,string *curPrefix,VarType *type
               ,deUint32 layoutFlags)

{
  bool bVar1;
  int iVar2;
  deInt32 dVar3;
  DataType DVar4;
  DataType type_00;
  int iVar5;
  StructType *pSVar6;
  pointer pSVar7;
  char *__rhs;
  VarType *pVVar8;
  int local_2c0;
  int local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
  local_228;
  __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
  local_220;
  ConstIterator memberIter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  int local_194;
  undefined1 local_190 [4];
  int elemNdx;
  undefined1 local_170 [8];
  UniformLayoutEntry entry_2;
  int stride_2;
  int numVecs_1;
  int vecSize_1;
  undefined1 local_118 [3];
  bool isRowMajor_1;
  DataType elemBasicType_1;
  int local_f4;
  undefined1 local_f0 [4];
  int stride_1;
  UniformLayoutEntry entry_1;
  DataType elemBasicType;
  VarType *elemType;
  int stride;
  int numVecs;
  int vecSize;
  bool isRowMajor;
  undefined1 local_80 [8];
  UniformLayoutEntry entry;
  DataType basicType;
  int baseAlignment;
  deUint32 layoutFlags_local;
  VarType *type_local;
  string *curPrefix_local;
  int curBlockNdx_local;
  int *curOffset_local;
  UniformLayout *layout_local;
  
  iVar2 = computeStd140BaseAlignment(type);
  dVar3 = deAlign32(*curOffset,iVar2);
  *curOffset = dVar3;
  bVar1 = ub::VarType::isBasicType(type);
  if (bVar1) {
    entry._60_4_ = ub::VarType::getBasicType(type);
    UniformLayoutEntry::UniformLayoutEntry((UniformLayoutEntry *)local_80);
    std::__cxx11::string::operator=((string *)local_80,(string *)curPrefix);
    entry.name.field_2._8_4_ = entry._60_4_;
    entry.name.field_2._12_4_ = 1;
    entry.blockNdx = 0;
    entry.offset = 0;
    entry.type = curBlockNdx;
    bVar1 = glu::isDataTypeMatrix(entry._60_4_);
    if (bVar1) {
      bVar1 = (layoutFlags & 0x40) != 0;
      if (bVar1) {
        iVar2 = glu::getDataTypeMatrixNumColumns(entry._60_4_);
        local_290 = glu::getDataTypeMatrixNumRows(entry._60_4_);
      }
      else {
        iVar2 = glu::getDataTypeMatrixNumRows(entry._60_4_);
        local_290 = glu::getDataTypeMatrixNumColumns(entry._60_4_);
      }
      DVar4 = glu::getDataTypeFloatVec(iVar2);
      entry.offset = getDataTypeArrayStride(DVar4);
      entry.size = *curOffset;
      *curOffset = local_290 * entry.offset + *curOffset;
      entry.arrayStride._0_1_ = bVar1;
    }
    else {
      entry.size = *curOffset;
      iVar2 = getDataTypeByteSize(entry._60_4_);
      *curOffset = iVar2 + *curOffset;
    }
    std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
    push_back(&layout->uniforms,(value_type *)local_80);
    UniformLayoutEntry::~UniformLayoutEntry((UniformLayoutEntry *)local_80);
  }
  else {
    bVar1 = ub::VarType::isArrayType(type);
    if (bVar1) {
      pVVar8 = ub::VarType::getElementType(type);
      bVar1 = ub::VarType::isBasicType(pVVar8);
      if (bVar1) {
        DVar4 = ub::VarType::getBasicType(pVVar8);
        bVar1 = glu::isDataTypeMatrix(DVar4);
        if (!bVar1) {
          entry_1._60_4_ = ub::VarType::getBasicType(pVVar8);
          UniformLayoutEntry::UniformLayoutEntry((UniformLayoutEntry *)local_f0);
          local_f4 = getDataTypeArrayStride(entry_1._60_4_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118,curPrefix,"[0]");
          std::__cxx11::string::operator=((string *)local_f0,(string *)local_118);
          std::__cxx11::string::~string((string *)local_118);
          entry_1.name.field_2._8_4_ = entry_1._60_4_;
          entry_1.size = *curOffset;
          entry_1.type = curBlockNdx;
          entry_1.name.field_2._12_4_ = ub::VarType::getArraySize(type);
          iVar2 = local_f4;
          entry_1.blockNdx = local_f4;
          entry_1.offset = 0;
          iVar5 = ub::VarType::getArraySize(type);
          *curOffset = *curOffset + iVar2 * iVar5;
          std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
          push_back(&layout->uniforms,(value_type *)local_f0);
          UniformLayoutEntry::~UniformLayoutEntry((UniformLayoutEntry *)local_f0);
          return;
        }
      }
      bVar1 = ub::VarType::isBasicType(pVVar8);
      if (bVar1) {
        DVar4 = ub::VarType::getBasicType(pVVar8);
        bVar1 = glu::isDataTypeMatrix(DVar4);
        if (bVar1) {
          DVar4 = ub::VarType::getBasicType(pVVar8);
          bVar1 = (layoutFlags & 0x40) != 0;
          if (bVar1) {
            iVar2 = glu::getDataTypeMatrixNumColumns(DVar4);
            local_2c0 = glu::getDataTypeMatrixNumRows(DVar4);
          }
          else {
            iVar2 = glu::getDataTypeMatrixNumRows(DVar4);
            local_2c0 = glu::getDataTypeMatrixNumColumns(DVar4);
          }
          type_00 = glu::getDataTypeFloatVec(iVar2);
          entry_2._60_4_ = getDataTypeArrayStride(type_00);
          UniformLayoutEntry::UniformLayoutEntry((UniformLayoutEntry *)local_170);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_190,curPrefix,"[0]");
          std::__cxx11::string::operator=((string *)local_170,(string *)local_190);
          std::__cxx11::string::~string((string *)local_190);
          entry_2.size = *curOffset;
          entry_2.name.field_2._8_4_ = DVar4;
          entry_2.type = curBlockNdx;
          entry_2.name.field_2._12_4_ = ub::VarType::getArraySize(type);
          entry_2.blockNdx = entry_2._60_4_ * local_2c0;
          entry_2.offset = entry_2._60_4_;
          entry_2.arrayStride._0_1_ = bVar1;
          iVar2 = ub::VarType::getArraySize(type);
          *curOffset = *curOffset + local_2c0 * iVar2 * entry_2._60_4_;
          std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
          push_back(&layout->uniforms,(value_type *)local_170);
          UniformLayoutEntry::~UniformLayoutEntry((UniformLayoutEntry *)local_170);
          return;
        }
      }
      for (local_194 = 0; iVar2 = local_194, iVar5 = ub::VarType::getArraySize(type), iVar2 < iVar5;
          local_194 = local_194 + 1) {
        std::operator+(&local_1f8,curPrefix,"[");
        de::toString<int>((string *)&memberIter,&local_194);
        std::operator+(&local_1d8,&local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &memberIter);
        std::operator+(&local_1b8,&local_1d8,"]");
        pVVar8 = ub::VarType::getElementType(type);
        computeStd140Layout(layout,curOffset,curBlockNdx,&local_1b8,pVVar8,layoutFlags);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&memberIter);
        std::__cxx11::string::~string((string *)&local_1f8);
      }
    }
    else {
      pSVar6 = ub::VarType::getStruct(type);
      local_220._M_current = (StructMember *)StructType::begin(pSVar6);
      while( true ) {
        pSVar6 = ub::VarType::getStruct(type);
        local_228._M_current = (StructMember *)StructType::end(pSVar6);
        bVar1 = __gnu_cxx::operator!=(&local_220,&local_228);
        if (!bVar1) break;
        std::operator+(&local_268,curPrefix,".");
        pSVar7 = __gnu_cxx::
                 __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
                 ::operator->(&local_220);
        __rhs = StructMember::getName(pSVar7);
        std::operator+(&local_248,&local_268,__rhs);
        pSVar7 = __gnu_cxx::
                 __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
                 ::operator->(&local_220);
        pVVar8 = StructMember::getType(pSVar7);
        computeStd140Layout(layout,curOffset,curBlockNdx,&local_248,pVVar8,layoutFlags);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        __gnu_cxx::
        __normal_iterator<const_deqp::ub::StructMember_*,_std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>_>
        ::operator++(&local_220,0);
      }
      dVar3 = deAlign32(*curOffset,iVar2);
      *curOffset = dVar3;
    }
  }
  return;
}

Assistant:

void computeStd140Layout(UniformLayout& layout, int& curOffset, int curBlockNdx, const std::string& curPrefix,
						 const VarType& type, deUint32 layoutFlags)
{
	int baseAlignment = computeStd140BaseAlignment(type);

	curOffset = deAlign32(curOffset, baseAlignment);

	if (type.isBasicType())
	{
		glu::DataType	  basicType = type.getBasicType();
		UniformLayoutEntry entry;

		entry.name		   = curPrefix;
		entry.type		   = basicType;
		entry.size		   = 1;
		entry.arrayStride  = 0;
		entry.matrixStride = 0;
		entry.blockNdx	 = curBlockNdx;

		if (glu::isDataTypeMatrix(basicType))
		{
			// Array of vectors as specified in rules 5 & 7.
			bool isRowMajor = !!(layoutFlags & LAYOUT_ROW_MAJOR);
			int  vecSize =
				isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType) : glu::getDataTypeMatrixNumRows(basicType);
			int numVecs =
				isRowMajor ? glu::getDataTypeMatrixNumRows(basicType) : glu::getDataTypeMatrixNumColumns(basicType);
			int stride = getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));

			entry.offset	   = curOffset;
			entry.matrixStride = stride;
			entry.isRowMajor   = isRowMajor;

			curOffset += numVecs * stride;
		}
		else
		{
			// Scalar or vector.
			entry.offset = curOffset;

			curOffset += getDataTypeByteSize(basicType);
		}

		layout.uniforms.push_back(entry);
	}
	else if (type.isArrayType())
	{
		const VarType& elemType = type.getElementType();

		if (elemType.isBasicType() && !glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of scalars or vectors.
			glu::DataType	  elemBasicType = elemType.getBasicType();
			UniformLayoutEntry entry;
			int				   stride = getDataTypeArrayStride(elemBasicType);

			entry.name		   = curPrefix + "[0]"; // Array uniforms are always postfixed with [0]
			entry.type		   = elemBasicType;
			entry.blockNdx	 = curBlockNdx;
			entry.offset	   = curOffset;
			entry.size		   = type.getArraySize();
			entry.arrayStride  = stride;
			entry.matrixStride = 0;

			curOffset += stride * type.getArraySize();

			layout.uniforms.push_back(entry);
		}
		else if (elemType.isBasicType() && glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of matrices.
			glu::DataType elemBasicType = elemType.getBasicType();
			bool		  isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			int			  vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(elemBasicType) :
									   glu::getDataTypeMatrixNumRows(elemBasicType);
			int numVecs = isRowMajor ? glu::getDataTypeMatrixNumRows(elemBasicType) :
									   glu::getDataTypeMatrixNumColumns(elemBasicType);
			int				   stride = getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));
			UniformLayoutEntry entry;

			entry.name		   = curPrefix + "[0]"; // Array uniforms are always postfixed with [0]
			entry.type		   = elemBasicType;
			entry.blockNdx	 = curBlockNdx;
			entry.offset	   = curOffset;
			entry.size		   = type.getArraySize();
			entry.arrayStride  = stride * numVecs;
			entry.matrixStride = stride;
			entry.isRowMajor   = isRowMajor;

			curOffset += numVecs * type.getArraySize() * stride;

			layout.uniforms.push_back(entry);
		}
		else
		{
			DE_ASSERT(elemType.isStructType() || elemType.isArrayType());

			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
				computeStd140Layout(layout, curOffset, curBlockNdx, curPrefix + "[" + de::toString(elemNdx) + "]",
									type.getElementType(), layoutFlags);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end();
			 memberIter++)
			computeStd140Layout(layout, curOffset, curBlockNdx, curPrefix + "." + memberIter->getName(),
								memberIter->getType(), layoutFlags);

		curOffset = deAlign32(curOffset, baseAlignment);
	}
}